

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTest_setDataForBooleanValues_Test::testBody
          (TEST_MockSupportTest_setDataForBooleanValues_Test *this)

{
  bool bVar1;
  bool bVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  SimpleString local_228;
  SimpleString local_218;
  MockNamedValue local_208;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  MockNamedValue local_178;
  SimpleString local_128;
  SimpleString local_118;
  MockNamedValue local_108;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  SimpleString local_28;
  byte local_11;
  TEST_MockSupportTest_setDataForBooleanValues_Test *pTStack_10;
  bool expected_data;
  TEST_MockSupportTest_setDataForBooleanValues_Test *this_local;
  
  local_11 = 1;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"data");
  MockSupport::setData(pMVar3,local_48,(bool)(local_11 & 1));
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  bVar2 = (bool)(local_11 & 1);
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"data");
  MockSupport::getData(&local_98,pMVar3,&local_b8);
  bVar1 = MockNamedValue::getBoolValue(&local_98);
  MockNamedValue::~MockNamedValue(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  if (bVar2 == bVar1) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
               ,0x43,pTVar7);
  }
  else {
    SimpleString::SimpleString(&local_118,"");
    pMVar3 = mock(&local_118,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_128,"data");
    MockSupport::getData(&local_108,pMVar3,&local_128);
    bVar2 = MockNamedValue::getBoolValue(&local_108);
    SimpleString::SimpleString(&local_188,"");
    pMVar3 = mock(&local_188,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_198,"data");
    MockSupport::getData(&local_178,pMVar3,&local_198);
    bVar1 = MockNamedValue::getBoolValue(&local_178);
    MockNamedValue::~MockNamedValue(&local_178);
    SimpleString::~SimpleString(&local_198);
    SimpleString::~SimpleString(&local_188);
    MockNamedValue::~MockNamedValue(&local_108);
    SimpleString::~SimpleString(&local_128);
    SimpleString::~SimpleString(&local_118);
    if (bVar2 != bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
                 ,0x43);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_1a8,0));
    pcVar5 = SimpleString::asCharString(&local_1a8);
    SimpleString::SimpleString(&local_218,"");
    pMVar3 = mock(&local_218,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_228,"data");
    MockSupport::getData(&local_208,pMVar3,&local_228);
    MockNamedValue::getBoolValue(&local_208);
    ::StringFrom(SUB81(&local_1b8,0));
    pcVar6 = SimpleString::asCharString(&local_1b8);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
               ,0x43,pTVar7);
    SimpleString::~SimpleString(&local_1b8);
    MockNamedValue::~MockNamedValue(&local_208);
    SimpleString::~SimpleString(&local_228);
    SimpleString::~SimpleString(&local_218);
    SimpleString::~SimpleString(&local_1a8);
  }
  return;
}

Assistant:

TEST(MockSupportTest, setDataForBooleanValues)
{
    bool expected_data = true;
    mock().setData("data", expected_data);
    CHECK_EQUAL(expected_data, mock().getData("data").getBoolValue());
}